

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O3

Expression * __thiscall
wasm::anon_unknown_173::FunctionOptimizer::makeExpression<wasm::StructGet>
          (FunctionOptimizer *this,PossibleConstantValues *info,HeapType type,StructGet *curr)

{
  pointer pFVar1;
  uint uVar2;
  bool bVar3;
  HeapTypeKind HVar4;
  Expression *pEVar5;
  Struct *pSVar6;
  Block *pBVar7;
  Drop *this_00;
  Module *wasm;
  MixedArena *this_01;
  optional<wasm::Type> type_00;
  Field local_58;
  undefined1 local_48;
  HeapType local_38;
  Builder builder;
  
  pEVar5 = PossibleConstantValues::makeExpression
                     (info,(this->
                           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                           ).
                           super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                           .currModule);
  uVar2 = curr->index;
  local_38.id = type.id;
  HVar4 = HeapType::getKind(&local_38);
  if (HVar4 == Array) {
    HeapType::getArray((HeapType *)&local_58);
  }
  else {
    if (HVar4 != Struct) {
      local_48 = 0;
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/ConstantFieldPropagation.cpp"
                    ,0x8f,
                    "Expression *wasm::(anonymous namespace)::FunctionOptimizer::makeExpression(const PossibleConstantValues &, HeapType, T *) [T = wasm::StructGet]"
                   );
    }
    pSVar6 = HeapType::getStruct(&local_38);
    pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start + uVar2;
    local_58.type.id = (pFVar1->type).id;
    local_58.packedType = pFVar1->packedType;
    local_58.mutable_ = pFVar1->mutable_;
  }
  local_48 = 1;
  wasm = (this->
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
         .currModule;
  pBVar7 = (Block *)Bits::makePackedFieldGet(pEVar5,&local_58,curr->signed_,wasm);
  bVar3 = wasm::Type::isSubType
                    ((Type)(pBVar7->super_SpecificExpression<(wasm::Expression::Id)1>).
                           super_Expression.type.id,local_58.type);
  if (!bVar3) {
    local_38.id = (uintptr_t)
                  (this->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                  .currModule;
    this_01 = &((Module *)local_38.id)->allocator;
    this_00 = (Drop *)MixedArena::allocSpace(this_01,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    this_00->value = (Expression *)pBVar7;
    Drop::finalize(this_00);
    pEVar5 = (Expression *)MixedArena::allocSpace(this_01,0x10,8);
    pEVar5->_id = UnreachableId;
    (pEVar5->type).id = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)wasm;
    pBVar7 = Builder::makeSequence((Builder *)&local_38,(Expression *)this_00,pEVar5,type_00);
  }
  return (Expression *)pBVar7;
}

Assistant:

Expression*
  makeExpression(const PossibleConstantValues& info, HeapType type, T* curr) {
    auto* value = info.makeExpression(*getModule());
    auto field = GCTypeUtils::getField(type, curr->index);
    assert(field);
    // Apply packing, if needed.
    if constexpr (std::is_same_v<T, StructGet>) {
      value =
        Bits::makePackedFieldGet(value, *field, curr->signed_, *getModule());
    }
    // Check if the value makes sense. The analysis below flows values around
    // without considering where they are placed, that is, when we see a parent
    // type can contain a value in a field then we assume a child may as well
    // (which in general it can, e.g., using a reference to the parent, we can
    // write that value to it, but the reference might actually point to a
    // child instance). If we tracked the types of fields then we might avoid
    // flowing values into places they cannot reside, like when a child field is
    // a subtype, and so we could ignore things not refined enough for it (GUFA
    // does a better job at this). For here, just check we do not break
    // validation, and if we do, then we've inferred the only possible value is
    // an impossible one, making the code unreachable.
    if (!Type::isSubType(value->type, field->type)) {
      Builder builder(*getModule());
      value = builder.makeSequence(builder.makeDrop(value),
                                   builder.makeUnreachable());
    }
    return value;
  }